

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void flatbuffers::php::PhpGenerator::GenEnum(EnumDef *enum_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumVal *pEVar2;
  EnumDef *pEVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string *code;
  pointer ppEVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  EnumDef *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    BeginEnum((string *)enum_def,code_ptr);
    for (ppEVar7 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar7 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
      pEVar2 = *ppEVar7;
      GenComment(&pEVar2->doc_comment,code_ptr,(CommentConfig *)0x0,Indent_abi_cxx11_);
      EnumMember(enum_def,pEVar2,code_ptr);
    }
    std::__cxx11::string::append((char *)code_ptr);
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,Indent_abi_cxx11_,Indent_abi_cxx11_ + DAT_003ebcb0);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    ppEVar7 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar3 = enum_def;
    if (ppEVar7 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        local_58 = pEVar3;
        pEVar2 = *ppEVar7;
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_50,
                                    (ulong)(enum_def->super_Definition).name._M_dataplus._M_p);
        local_d8 = &local_c8;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_c8 = *plVar5;
          lStack_c0 = plVar4[3];
        }
        else {
          local_c8 = *plVar5;
          local_d8 = (long *)*plVar4;
        }
        local_d0 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_b8 = &local_a8;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_a8 = *plVar5;
          lStack_a0 = plVar4[3];
        }
        else {
          local_a8 = *plVar5;
          local_b8 = (long *)*plVar4;
        }
        local_b0 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,(ulong)(pEVar2->name)._M_dataplus._M_p);
        local_98 = &local_88;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_88 = *plVar5;
          lStack_80 = plVar4[3];
        }
        else {
          local_88 = *plVar5;
          local_98 = (long *)*plVar4;
        }
        local_90 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_78 = &local_68;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_68 = *plVar5;
          lStack_60 = plVar4[3];
        }
        else {
          local_68 = *plVar5;
          local_78 = (long *)*plVar4;
        }
        local_70 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_f8.field_2._M_allocated_capacity = *psVar6;
          local_f8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar6;
          local_f8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_f8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_f8,(ulong)(pEVar2->name)._M_dataplus._M_p);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_118.field_2._M_allocated_capacity = *psVar6;
          local_118.field_2._8_8_ = plVar4[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar6;
          local_118._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_118._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_128 = *plVar5;
          lStack_120 = plVar4[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar5;
          local_138 = (long *)*plVar4;
        }
        local_130 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        enum_def = local_58;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppEVar7 = ppEVar7 + 1;
        pEVar3 = local_58;
      } while (ppEVar7 !=
               (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,Indent_abi_cxx11_,Indent_abi_cxx11_ + DAT_003ebcb0);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,Indent_abi_cxx11_,Indent_abi_cxx11_ + DAT_003ebcb0);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,Indent_abi_cxx11_,Indent_abi_cxx11_ + DAT_003ebcb0);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_128 = *plVar5;
      lStack_120 = plVar4[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar5;
      local_138 = (long *)*plVar4;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    paVar1 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)Indent_abi_cxx11_);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_118.field_2._M_allocated_capacity = *psVar6;
      local_118.field_2._8_8_ = plVar4[3];
      local_118._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar6;
      local_118._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_118._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_128 = *plVar5;
      lStack_120 = plVar4[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar5;
      local_138 = (long *)*plVar4;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_128 = *plVar5;
      lStack_120 = plVar4[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar5;
      local_138 = (long *)*plVar4;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_128 = *plVar5;
      lStack_120 = plVar4[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar5;
      local_138 = (long *)*plVar4;
    }
    local_130 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,Indent_abi_cxx11_,Indent_abi_cxx11_ + DAT_003ebcb0);
    std::__cxx11::string::append((char *)&local_138);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
  }
  return;
}

Assistant:

static void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;

    GenComment(enum_def.doc_comment, code_ptr, nullptr);
    BeginEnum(enum_def.name, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, Indent.c_str());
      EnumMember(enum_def, ev, code_ptr);
    }

    std::string &code = *code_ptr;
    code += "\n";
    code += Indent + "private static $names = array(\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      code += Indent + Indent + enum_def.name + "::" + ev.name + "=>" + "\"" +
              ev.name + "\",\n";
    }

    code += Indent + ");\n\n";
    code += Indent + "public static function Name($e)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "if (!isset(self::$names[$e])) {\n";
    code += Indent + Indent + Indent + "throw new \\Exception();\n";
    code += Indent + Indent + "}\n";
    code += Indent + Indent + "return self::$names[$e];\n";
    code += Indent + "}\n";
    EndEnum(code_ptr);
  }